

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O3

Graph<Node> * __thiscall
Graph<Node>::minSpanningTree(Graph<Node> *__return_storage_ptr__,Graph<Node> *this,int node)

{
  NodeList<Node> *this_00;
  uint uVar1;
  int iVar2;
  Edge *__size;
  undefined8 uVar3;
  Node *pNVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int *__s;
  int *__s_00;
  ulong uVar11;
  undefined8 *puVar12;
  NodeList<Node> *pNVar13;
  int iVar14;
  size_t __size_00;
  long lVar15;
  long lVar16;
  Edge *pEVar17;
  Graph<Node> *MST;
  vector<Edge> ccEdges;
  int dest;
  int source;
  vector<int> father;
  vector<int> depth;
  vector<Edge> local_70;
  int local_60;
  int local_5c;
  vector<int> local_58;
  vector<int> local_48;
  vector<Edge> *local_38;
  
  uVar1 = this->_nodeCnt;
  uVar5 = 1;
  do {
    uVar6 = uVar5;
    uVar5 = uVar6 * 2;
  } while ((int)uVar6 < (int)uVar1);
  uVar11 = 0xffffffffffffffff;
  if (-1 < (int)uVar6) {
    uVar11 = (ulong)uVar6 << 2;
  }
  local_58._size = uVar1;
  __s = (int *)operator_new__(uVar11);
  memset(__s,0,uVar11);
  uVar5 = 1;
  do {
    uVar7 = uVar5;
    uVar5 = uVar7 * 2;
  } while ((int)uVar7 < (int)uVar1);
  uVar11 = 0xffffffffffffffff;
  if (-1 < (int)uVar7) {
    uVar11 = (ulong)uVar7 << 2;
  }
  local_58.vect = __s;
  local_58._capacity = uVar6;
  local_48._size = uVar1;
  __s_00 = (int *)operator_new__(uVar11);
  memset(__s_00,0,uVar11);
  if (0 < (int)uVar1) {
    uVar11 = 0;
    do {
      __s[uVar11] = (int)uVar11;
      __s_00[uVar11] = 1;
      uVar11 = uVar11 + 1;
    } while (uVar1 != uVar11);
  }
  iVar2 = (this->inCC).vect[node];
  local_48.vect = __s_00;
  local_48._capacity = uVar7;
  puVar12 = (undefined8 *)operator_new__(0x14);
  *puVar12 = 1;
  pEVar17 = (Edge *)(puVar12 + 1);
  puVar12[1] = 0;
  *(undefined4 *)(puVar12 + 2) = 0;
  local_70._size = 0;
  local_70._capacity = 1;
  iVar8 = (this->edges)._size;
  local_70.vect = pEVar17;
  if (0 < iVar8) {
    iVar14 = 0;
    lVar16 = 8;
    lVar15 = 0;
    do {
      __size = (this->edges).vect;
      uVar3 = *(undefined8 *)((long)__size + lVar16 + -8);
      if ((this->inCC).vect[(int)uVar3] == iVar2) {
        iVar9 = *(int *)((long)&__size->_nodeS + lVar16);
        iVar10 = iVar14;
        if (local_70._capacity <= iVar14) {
          vector<Edge>::realloc
                    (&local_70,(void *)(ulong)(uint)(local_70._capacity * 2),(size_t)__size);
          iVar8 = (this->edges)._size;
          pEVar17 = local_70.vect;
          iVar10 = local_70._size;
        }
        iVar14 = iVar10 + 1;
        local_70._size = iVar14;
        pEVar17[iVar10]._nodeS = (int)uVar3;
        pEVar17[iVar10]._nodeD = (int)((ulong)uVar3 >> 0x20);
        pEVar17[iVar10]._cost = iVar9;
      }
      lVar15 = lVar15 + 1;
      lVar16 = lVar16 + 0xc;
    } while (lVar15 < iVar8);
    if (iVar14 != 0) {
      uVar11 = (ulong)iVar14;
      lVar15 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar15 == 0; lVar15 = lVar15 + -1) {
        }
      }
      std::
      __introsort_loop<Edge*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Edge_const&,Edge_const&)>>
                (pEVar17,pEVar17 + uVar11,(ulong)(((uint)lVar15 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(const_Edge_&,_const_Edge_&)>)0x103dfe);
      std::
      __final_insertion_sort<Edge*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Edge_const&,Edge_const&)>>
                (pEVar17,pEVar17 + uVar11,
                 (_Iter_comp_iter<bool_(*)(const_Edge_&,_const_Edge_&)>)0x103dfe);
    }
  }
  Graph(__return_storage_ptr__,this->_nodeCnt);
  if (0 < local_70._size) {
    local_38 = &__return_storage_ptr__->edges;
    lVar16 = 8;
    lVar15 = 0;
    do {
      iVar2 = *(int *)((long)local_70.vect + lVar16 + -8);
      iVar8 = *(int *)((long)local_70.vect + lVar16 + -4);
      iVar14 = *(int *)((long)&(local_70.vect)->_nodeS + lVar16);
      local_60 = iVar8;
      local_5c = iVar2;
      iVar9 = findRt(this,&local_58,&local_5c);
      iVar10 = findRt(this,&local_58,&local_60);
      if (iVar9 != iVar10) {
        mergeDSU(this,&local_58,&local_48,local_5c,local_60);
        __return_storage_ptr__->_edgeCnt = __return_storage_ptr__->_edgeCnt + 1;
        iVar9 = (__return_storage_ptr__->edges)._size;
        iVar10 = (__return_storage_ptr__->edges)._capacity;
        if (iVar10 <= iVar9) {
          vector<Edge>::realloc(local_38,(void *)(ulong)(uint)(iVar10 * 2),__size_00);
          iVar9 = (__return_storage_ptr__->edges)._size;
        }
        (__return_storage_ptr__->edges)._size = iVar9 + 1;
        pEVar17 = (__return_storage_ptr__->edges).vect;
        pEVar17[iVar9]._nodeS = iVar2;
        pEVar17[iVar9]._nodeD = iVar8;
        pEVar17[iVar9]._cost = iVar14;
        pNVar13 = (__return_storage_ptr__->G).vect;
        this_00 = pNVar13 + iVar2;
        iVar9 = (this_00->nodes)._size;
        iVar10 = (this_00->nodes)._capacity;
        if (iVar10 <= iVar9) {
          vector<Node>::realloc(&this_00->nodes,(void *)(ulong)(uint)(iVar10 * 2),(size_t)pEVar17);
          iVar9 = (this_00->nodes)._size;
          pNVar13 = (__return_storage_ptr__->G).vect;
        }
        (this_00->nodes)._size = iVar9 + 1;
        pNVar4 = (this_00->nodes).vect;
        pNVar4[iVar9]._index = iVar8;
        pNVar4[iVar9]._costTo = iVar14;
        pNVar13 = pNVar13 + iVar8;
        iVar9 = (pNVar13->nodes)._size;
        iVar10 = (pNVar13->nodes)._capacity;
        if (iVar10 <= iVar9) {
          vector<Node>::realloc(&pNVar13->nodes,(void *)(ulong)(uint)(iVar10 * 2),(long)iVar8);
          iVar9 = (pNVar13->nodes)._size;
        }
        (pNVar13->nodes)._size = iVar9 + 1;
        pNVar4 = (pNVar13->nodes).vect;
        pNVar4[iVar9]._index = iVar2;
        pNVar4[iVar9]._costTo = iVar14;
      }
      lVar15 = lVar15 + 1;
      lVar16 = lVar16 + 0xc;
    } while (lVar15 < local_70._size);
  }
  if (local_70.vect != (Edge *)0x0) {
    operator_delete__(&local_70.vect[-1]._nodeD);
  }
  if (local_48.vect != (int *)0x0) {
    operator_delete__(local_48.vect);
  }
  if (local_58.vect != (int *)0x0) {
    operator_delete__(local_58.vect);
  }
  return __return_storage_ptr__;
}

Assistant:

Graph minSpanningTree(int node) {
        vector <int> father(_nodeCnt);
        vector <int> depth(_nodeCnt);

        for (int i = 0; i < _nodeCnt; ++i) {
            father[i] = i;
            depth[i] = 1;
        }

        int currCC = inCC[node];

        vector <Edge> ccEdges;
        for (int i = 0; i < edges.size(); ++i) {
            Edge currEdge = getEdge(i);
            int source = currEdge.getSource();
            int dest = currEdge.getDest();

            if (inCC[source] == currCC) { //destination cannot be outside CC (the two nodes are connected)
                ccEdges.push_back(currEdge);
            }
        }

        std::sort(ccEdges.begin(), ccEdges.end(), byCostCmp);

//        ccEdges.mergeSort(0, ccEdges.size() - 1, [](Edge a, Edge b) {
//            return a.getCost() < b.getCost();
//        });

        Graph MST(_nodeCnt);

        for (int i = 0; i < ccEdges.size(); ++i) {
            Edge currEdge = ccEdges[i];
            int source = currEdge.getSource();
            int dest = currEdge.getDest();

            if (findRt(father, source) != findRt(father, dest)) {
                mergeDSU(father, depth, source, dest);
                MST.addEdge(currEdge);
            }
        }

        return MST;
    }